

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

void iemgui_new_dialog(void *x,t_iemgui *iemgui,char *objname,t_float width,t_float width_min,
                      t_float height,t_float height_min,t_float range_min,t_float range_max,
                      int schedule,int mode,char *label_mode0,char *label_mode1,int canloadbang,
                      int steady,int number)

{
  ulong uVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 in_register_00000084;
  t_symbol *srl [3];
  char objname_ [1000];
  
  iemgui_properties(iemgui,srl);
  sprintf(objname_,"|%s|",objname);
  if (canloadbang == 0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (ulong)((uint)iemgui->x_isa & 1);
  }
  pcVar2 = "";
  if (srl[0] != (t_symbol *)0x0) {
    pcVar2 = srl[0]->s_name;
  }
  pcVar3 = "";
  if (srl[1] != (t_symbol *)0x0) {
    pcVar3 = srl[1]->s_name;
  }
  pcVar4 = "";
  if (srl[2] != (t_symbol *)0x0) {
    pcVar4 = srl[2]->s_name;
  }
  pdgui_stub_vnew((t_pd *)iemgui,"pdtk_iemgui_dialog",x,
                  "r s ffs ffs sfsfs i iss ii si sss ii ii kkk",(double)width,(double)width_min,
                  (double)height,(double)height_min,(double)range_min,(double)range_max,objname_,"",
                  "","","","","",CONCAT44(in_register_0000000c,schedule),
                  CONCAT44(in_register_00000084,mode),label_mode0,label_mode1,uVar1,
                  (ulong)(uint)steady,"",(ulong)(uint)number,pcVar2,pcVar3,pcVar4,
                  (ulong)(uint)iemgui->x_ldx,(ulong)(uint)iemgui->x_ldy,
                  (ulong)((uint)iemgui->x_fsf & 0x3f),(ulong)(uint)iemgui->x_fontsize,
                  (ulong)(uint)iemgui->x_bcol,(ulong)(uint)iemgui->x_fcol,
                  (ulong)(uint)iemgui->x_lcol);
  return;
}

Assistant:

void iemgui_new_dialog(void*x, t_iemgui*iemgui,
                       const char*objname,
                       t_float width,  t_float width_min,
                       t_float height, t_float height_min,
                       t_float range_min, t_float range_max,
                       int schedule,
                       int mode, /* lin0_log1 */
                       const char* label_mode0,
                       const char* label_mode1,
                       int canloadbang, int steady, int number)
{
    char objname_[MAXPDSTRING];
    t_symbol *srl[3];
    iemgui_properties(iemgui, srl);
    sprintf(objname_, "|%s|", objname);

    pdgui_stub_vnew(&iemgui->x_obj.ob_pd, "pdtk_iemgui_dialog", x,
        "r s ffs ffs sfsfs i iss ii si sss ii ii kkk",
        objname_,
        "",
        width, width_min, "",
        height, height_min, "",
        "", range_min, "", range_max, "",
        schedule,
        mode, label_mode0, label_mode1,
        canloadbang?iemgui->x_isa.x_loadinit:-1, steady,
        "", number,
        srl[0]?srl[0]->s_name:"", srl[1]?srl[1]->s_name:"", srl[2]?srl[2]->s_name:"",
        iemgui->x_ldx, iemgui->x_ldy,
        iemgui->x_fsf.x_font_style, iemgui->x_fontsize,
        iemgui->x_bcol, iemgui->x_fcol, iemgui->x_lcol);
}